

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  Scene *pSVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Geometry *pGVar9;
  RTCIntersectArguments *pRVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  bool bVar26;
  undefined1 auVar27 [16];
  ulong *puVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  undefined4 uVar33;
  ulong unaff_RBP;
  size_t mask;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  int iVar37;
  ulong uVar38;
  size_t sVar39;
  ulong uVar40;
  ulong uVar41;
  bool bVar42;
  float fVar50;
  undefined1 auVar43 [16];
  float fVar51;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float fVar71;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  float fVar84;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar73 [16];
  float fVar85;
  undefined1 auVar80 [32];
  float fVar86;
  float fVar87;
  float fVar95;
  float fVar97;
  float fVar98;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar94;
  float fVar96;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  float fVar99;
  float fVar112;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar100;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar110;
  float fVar111;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar144;
  float fVar147;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar150;
  undefined1 auVar141 [16];
  float fVar145;
  float fVar148;
  float fVar151;
  undefined1 auVar142 [16];
  float fVar146;
  float fVar149;
  float fVar152;
  undefined1 auVar143 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar162;
  float fVar163;
  undefined1 auVar161 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar167 [16];
  float fVar173;
  undefined1 auVar168 [16];
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  UVIdentity<4> mapUV;
  Scene *scene;
  int local_152c;
  undefined8 local_1528;
  float fStack_1520;
  float fStack_151c;
  undefined8 local_1518;
  float fStack_1510;
  float fStack_150c;
  NodeRef *local_1500;
  RayQueryContext *local_14f8;
  ulong local_14f0;
  ulong local_14e8;
  ulong local_14e0;
  ulong local_14d8;
  ulong local_14d0;
  ulong local_14c8;
  ulong local_14c0;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  UVIdentity<4> *local_1358;
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  undefined1 local_1318 [16];
  undefined1 local_1308 [16];
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined4 local_1238;
  undefined4 uStack_1234;
  undefined4 uStack_1230;
  undefined4 uStack_122c;
  undefined4 uStack_1228;
  undefined4 uStack_1224;
  undefined4 uStack_1220;
  undefined4 uStack_121c;
  undefined4 local_1218;
  undefined4 uStack_1214;
  undefined4 uStack_1210;
  undefined4 uStack_120c;
  undefined4 uStack_1208;
  undefined4 uStack_1204;
  undefined4 uStack_1200;
  undefined4 uStack_11fc;
  undefined4 local_11f8;
  undefined4 uStack_11f4;
  undefined4 uStack_11f0;
  undefined4 uStack_11ec;
  undefined4 uStack_11e8;
  undefined4 uStack_11e4;
  undefined4 uStack_11e0;
  undefined4 uStack_11dc;
  NodeRef stack [564];
  
  auVar27 = mm_lookupmask_ps._240_16_;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar87 = ray->tfar;
    if (0.0 <= fVar87) {
      local_1500 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar43 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar2 = (ray->dir).field_0;
      auVar88._8_4_ = 0x7fffffff;
      auVar88._0_8_ = 0x7fffffff7fffffff;
      auVar88._12_4_ = 0x7fffffff;
      auVar88 = vandps_avx((undefined1  [16])aVar2,auVar88);
      auVar118._8_4_ = 0x219392ef;
      auVar118._0_8_ = 0x219392ef219392ef;
      auVar118._12_4_ = 0x219392ef;
      auVar88 = vcmpps_avx(auVar88,auVar118,1);
      auVar88 = vblendvps_avx((undefined1  [16])aVar2,auVar118,auVar88);
      auVar118 = vrcpps_avx(auVar88);
      fVar86 = auVar118._0_4_;
      auVar119._0_4_ = fVar86 * auVar88._0_4_;
      fVar94 = auVar118._4_4_;
      auVar119._4_4_ = fVar94 * auVar88._4_4_;
      fVar96 = auVar118._8_4_;
      auVar119._8_4_ = fVar96 * auVar88._8_4_;
      fVar81 = auVar118._12_4_;
      auVar119._12_4_ = fVar81 * auVar88._12_4_;
      auVar101._8_4_ = 0x3f800000;
      auVar101._0_8_ = &DAT_3f8000003f800000;
      auVar101._12_4_ = 0x3f800000;
      auVar88 = vsubps_avx(auVar101,auVar119);
      local_11f8 = *(undefined4 *)&(ray->org).field_0;
      uStack_11f4 = local_11f8;
      uStack_11f0 = local_11f8;
      uStack_11ec = local_11f8;
      uStack_11e8 = local_11f8;
      uStack_11e4 = local_11f8;
      uStack_11e0 = local_11f8;
      uStack_11dc = local_11f8;
      local_1218 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      uStack_1214 = local_1218;
      uStack_1210 = local_1218;
      uStack_120c = local_1218;
      uStack_1208 = local_1218;
      uStack_1204 = local_1218;
      uStack_1200 = local_1218;
      uStack_11fc = local_1218;
      auVar72._0_4_ = fVar86 + fVar86 * auVar88._0_4_;
      auVar72._4_4_ = fVar94 + fVar94 * auVar88._4_4_;
      auVar72._8_4_ = fVar96 + fVar96 * auVar88._8_4_;
      auVar72._12_4_ = fVar81 + fVar81 * auVar88._12_4_;
      local_1238 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      uStack_1234 = local_1238;
      uStack_1230 = local_1238;
      uStack_122c = local_1238;
      uStack_1228 = local_1238;
      uStack_1224 = local_1238;
      uStack_1220 = local_1238;
      uStack_121c = local_1238;
      auVar88 = vshufps_avx(auVar72,auVar72,0);
      local_1258._16_16_ = auVar88;
      local_1258._0_16_ = auVar88;
      auVar88 = vmovshdup_avx(auVar72);
      auVar118 = vshufps_avx(auVar72,auVar72,0x55);
      local_1278._16_16_ = auVar118;
      local_1278._0_16_ = auVar118;
      auVar118 = vshufpd_avx(auVar72,auVar72,1);
      auVar119 = vshufps_avx(auVar72,auVar72,0xaa);
      local_1298._16_16_ = auVar119;
      local_1298._0_16_ = auVar119;
      auVar43 = vshufps_avx(auVar43,auVar43,0);
      local_12b8._16_16_ = auVar43;
      local_12b8._0_16_ = auVar43;
      auVar43 = vshufps_avx(ZEXT416((uint)fVar87),ZEXT416((uint)fVar87),0);
      local_12d8._16_16_ = auVar43;
      local_12d8._0_16_ = auVar43;
      uVar36 = (ulong)(auVar72._0_4_ < 0.0) << 3;
      uVar34 = uVar36 ^ 8;
      uVar35 = (ulong)((uint)(auVar88._0_4_ < 0.0) * 8 + 0x10);
      uVar32 = uVar35 ^ 8;
      uVar40 = (ulong)((uint)(auVar118._0_4_ < 0.0) * 8 + 0x20);
      local_14f0 = uVar40 ^ 8;
      local_14f8 = context;
      uVar41 = local_14f0;
      local_14e8 = uVar40;
      local_14e0 = uVar32;
      local_14d8 = uVar35;
      local_14d0 = uVar34;
      do {
        if (local_1500 == stack) {
          return;
        }
        sVar39 = local_1500[-1].ptr;
        local_1500 = local_1500 + -1;
        do {
          if ((sVar39 & 8) == 0) {
            puVar28 = (ulong *)((sVar39 & 0xfffffffffffffff0) + 0x40);
            if ((sVar39 & 0xfffffffffffffff0) == 0) {
              puVar28 = (ulong *)0x0;
            }
            auVar43._8_8_ = 0;
            auVar43._0_8_ = *puVar28;
            auVar60._8_8_ = 0;
            auVar60._0_8_ = puVar28[1];
            auVar88 = vpminub_avx(auVar43,auVar60);
            auVar88 = vpcmpeqb_avx(auVar43,auVar88);
            auVar52._8_8_ = 0;
            auVar52._0_8_ = *(ulong *)((long)puVar28 + 4);
            auVar73._8_8_ = 0;
            auVar73._0_8_ = *(ulong *)((long)puVar28 + 0xc);
            auVar43 = vpminub_avx(auVar52,auVar73);
            auVar43 = vpcmpeqb_avx(auVar52,auVar43);
            fVar87 = *(float *)(puVar28 + 6);
            fVar86 = *(float *)((long)puVar28 + 0x3c);
            auVar61._8_8_ = 0;
            auVar61._0_8_ = *(ulong *)((long)puVar28 + uVar36);
            auVar118 = vpmovzxbd_avx(auVar61);
            auVar102._8_8_ = 0;
            auVar102._0_8_ = *(ulong *)((long)puVar28 + uVar36 + 4);
            auVar119 = vpmovzxbd_avx(auVar102);
            auVar69._16_16_ = auVar119;
            auVar69._0_16_ = auVar118;
            auVar69 = vcvtdq2ps_avx(auVar69);
            auVar70._0_4_ = fVar87 + fVar86 * auVar69._0_4_;
            auVar70._4_4_ = fVar87 + fVar86 * auVar69._4_4_;
            auVar70._8_4_ = fVar87 + fVar86 * auVar69._8_4_;
            auVar70._12_4_ = fVar87 + fVar86 * auVar69._12_4_;
            auVar70._16_4_ = fVar87 + fVar86 * auVar69._16_4_;
            auVar70._20_4_ = fVar87 + fVar86 * auVar69._20_4_;
            auVar70._24_4_ = fVar87 + fVar86 * auVar69._24_4_;
            auVar70._28_4_ = fVar87 + auVar69._28_4_;
            auVar103._8_8_ = 0;
            auVar103._0_8_ = *(ulong *)((long)puVar28 + uVar34);
            auVar118 = vpmovzxbd_avx(auVar103);
            auVar113._8_8_ = 0;
            auVar113._0_8_ = *(ulong *)((long)puVar28 + uVar34 + 4);
            auVar119 = vpmovzxbd_avx(auVar113);
            auVar108._16_16_ = auVar119;
            auVar108._0_16_ = auVar118;
            auVar69 = vcvtdq2ps_avx(auVar108);
            auVar80._0_4_ = fVar87 + fVar86 * auVar69._0_4_;
            auVar80._4_4_ = fVar87 + fVar86 * auVar69._4_4_;
            auVar80._8_4_ = fVar87 + fVar86 * auVar69._8_4_;
            auVar80._12_4_ = fVar87 + fVar86 * auVar69._12_4_;
            auVar80._16_4_ = fVar87 + fVar86 * auVar69._16_4_;
            auVar80._20_4_ = fVar87 + fVar86 * auVar69._20_4_;
            auVar80._24_4_ = fVar87 + fVar86 * auVar69._24_4_;
            auVar80._28_4_ = fVar87 + fVar86;
            fVar87 = *(float *)((long)puVar28 + 0x34);
            fVar86 = *(float *)(puVar28 + 8);
            auVar89._8_8_ = 0;
            auVar89._0_8_ = *(ulong *)((long)puVar28 + uVar35);
            auVar118 = vpmovzxbd_avx(auVar89);
            auVar122._8_8_ = 0;
            auVar122._0_8_ = *(ulong *)((long)puVar28 + uVar35 + 4);
            auVar119 = vpmovzxbd_avx(auVar122);
            auVar92._16_16_ = auVar119;
            auVar92._0_16_ = auVar118;
            auVar69 = vcvtdq2ps_avx(auVar92);
            auVar93._0_4_ = fVar87 + fVar86 * auVar69._0_4_;
            auVar93._4_4_ = fVar87 + fVar86 * auVar69._4_4_;
            auVar93._8_4_ = fVar87 + fVar86 * auVar69._8_4_;
            auVar93._12_4_ = fVar87 + fVar86 * auVar69._12_4_;
            auVar93._16_4_ = fVar87 + fVar86 * auVar69._16_4_;
            auVar93._20_4_ = fVar87 + fVar86 * auVar69._20_4_;
            auVar93._24_4_ = fVar87 + fVar86 * auVar69._24_4_;
            auVar93._28_4_ = fVar87 + auVar69._28_4_;
            auVar123._8_8_ = 0;
            auVar123._0_8_ = *(ulong *)((long)puVar28 + uVar32);
            auVar118 = vpmovzxbd_avx(auVar123);
            auVar138._8_8_ = 0;
            auVar138._0_8_ = *(ulong *)((long)puVar28 + uVar32 + 4);
            auVar119 = vpmovzxbd_avx(auVar138);
            auVar132._16_16_ = auVar119;
            auVar132._0_16_ = auVar118;
            auVar69 = vcvtdq2ps_avx(auVar132);
            auVar109._0_4_ = fVar87 + fVar86 * auVar69._0_4_;
            auVar109._4_4_ = fVar87 + fVar86 * auVar69._4_4_;
            auVar109._8_4_ = fVar87 + fVar86 * auVar69._8_4_;
            auVar109._12_4_ = fVar87 + fVar86 * auVar69._12_4_;
            auVar109._16_4_ = fVar87 + fVar86 * auVar69._16_4_;
            auVar109._20_4_ = fVar87 + fVar86 * auVar69._20_4_;
            auVar109._24_4_ = fVar87 + fVar86 * auVar69._24_4_;
            auVar109._28_4_ = fVar87 + fVar86;
            auVar114._8_8_ = 0;
            auVar114._0_8_ = *(ulong *)((long)puVar28 + uVar40);
            auVar118 = vpmovzxbd_avx(auVar114);
            auVar124._8_8_ = 0;
            auVar124._0_8_ = *(ulong *)((long)puVar28 + uVar40 + 4);
            auVar119 = vpmovzxbd_avx(auVar124);
            auVar120._16_16_ = auVar119;
            auVar120._0_16_ = auVar118;
            auVar125._8_8_ = 0;
            auVar125._0_8_ = *(ulong *)((long)puVar28 + uVar41);
            auVar118 = vpmovzxbd_avx(auVar125);
            auVar139._8_8_ = 0;
            auVar139._0_8_ = *(ulong *)((long)puVar28 + uVar41 + 4);
            auVar119 = vpmovzxbd_avx(auVar139);
            auVar133._16_16_ = auVar119;
            auVar133._0_16_ = auVar118;
            fVar87 = *(float *)((long)puVar28 + 0x44);
            auVar69 = vcvtdq2ps_avx(auVar120);
            auVar17 = vcvtdq2ps_avx(auVar133);
            fVar86 = *(float *)(puVar28 + 7);
            auVar121._0_4_ = fVar86 + fVar87 * auVar69._0_4_;
            auVar121._4_4_ = fVar86 + fVar87 * auVar69._4_4_;
            auVar121._8_4_ = fVar86 + fVar87 * auVar69._8_4_;
            auVar121._12_4_ = fVar86 + fVar87 * auVar69._12_4_;
            auVar121._16_4_ = fVar86 + fVar87 * auVar69._16_4_;
            auVar121._20_4_ = fVar86 + fVar87 * auVar69._20_4_;
            auVar121._24_4_ = fVar86 + fVar87 * auVar69._24_4_;
            auVar121._28_4_ = fVar86 + auVar69._28_4_;
            auVar134._0_4_ = fVar86 + fVar87 * auVar17._0_4_;
            auVar134._4_4_ = fVar86 + fVar87 * auVar17._4_4_;
            auVar134._8_4_ = fVar86 + fVar87 * auVar17._8_4_;
            auVar134._12_4_ = fVar86 + fVar87 * auVar17._12_4_;
            auVar134._16_4_ = fVar86 + fVar87 * auVar17._16_4_;
            auVar134._20_4_ = fVar86 + fVar87 * auVar17._20_4_;
            auVar134._24_4_ = fVar86 + fVar87 * auVar17._24_4_;
            auVar134._28_4_ = fVar86 + auVar17._28_4_;
            auVar25._4_4_ = uStack_11f4;
            auVar25._0_4_ = local_11f8;
            auVar25._8_4_ = uStack_11f0;
            auVar25._12_4_ = uStack_11ec;
            auVar25._16_4_ = uStack_11e8;
            auVar25._20_4_ = uStack_11e4;
            auVar25._24_4_ = uStack_11e0;
            auVar25._28_4_ = uStack_11dc;
            auVar69 = vsubps_avx(auVar70,auVar25);
            auVar17._4_4_ = local_1258._4_4_ * auVar69._4_4_;
            auVar17._0_4_ = local_1258._0_4_ * auVar69._0_4_;
            auVar17._8_4_ = local_1258._8_4_ * auVar69._8_4_;
            auVar17._12_4_ = local_1258._12_4_ * auVar69._12_4_;
            auVar17._16_4_ = local_1258._16_4_ * auVar69._16_4_;
            auVar17._20_4_ = local_1258._20_4_ * auVar69._20_4_;
            auVar17._24_4_ = local_1258._24_4_ * auVar69._24_4_;
            auVar17._28_4_ = auVar69._28_4_;
            auVar24._4_4_ = uStack_1214;
            auVar24._0_4_ = local_1218;
            auVar24._8_4_ = uStack_1210;
            auVar24._12_4_ = uStack_120c;
            auVar24._16_4_ = uStack_1208;
            auVar24._20_4_ = uStack_1204;
            auVar24._24_4_ = uStack_1200;
            auVar24._28_4_ = uStack_11fc;
            auVar69 = vsubps_avx(auVar93,auVar24);
            auVar18._4_4_ = local_1278._4_4_ * auVar69._4_4_;
            auVar18._0_4_ = local_1278._0_4_ * auVar69._0_4_;
            auVar18._8_4_ = local_1278._8_4_ * auVar69._8_4_;
            auVar18._12_4_ = local_1278._12_4_ * auVar69._12_4_;
            auVar18._16_4_ = local_1278._16_4_ * auVar69._16_4_;
            auVar18._20_4_ = local_1278._20_4_ * auVar69._20_4_;
            auVar18._24_4_ = local_1278._24_4_ * auVar69._24_4_;
            auVar18._28_4_ = auVar69._28_4_;
            auVar69 = vmaxps_avx(auVar17,auVar18);
            auVar23._4_4_ = uStack_1234;
            auVar23._0_4_ = local_1238;
            auVar23._8_4_ = uStack_1230;
            auVar23._12_4_ = uStack_122c;
            auVar23._16_4_ = uStack_1228;
            auVar23._20_4_ = uStack_1224;
            auVar23._24_4_ = uStack_1220;
            auVar23._28_4_ = uStack_121c;
            auVar17 = vsubps_avx(auVar121,auVar23);
            auVar19._4_4_ = local_1298._4_4_ * auVar17._4_4_;
            auVar19._0_4_ = local_1298._0_4_ * auVar17._0_4_;
            auVar19._8_4_ = local_1298._8_4_ * auVar17._8_4_;
            auVar19._12_4_ = local_1298._12_4_ * auVar17._12_4_;
            auVar19._16_4_ = local_1298._16_4_ * auVar17._16_4_;
            auVar19._20_4_ = local_1298._20_4_ * auVar17._20_4_;
            auVar19._24_4_ = local_1298._24_4_ * auVar17._24_4_;
            auVar19._28_4_ = auVar17._28_4_;
            auVar17 = vmaxps_avx(auVar19,local_12b8);
            auVar69 = vmaxps_avx(auVar69,auVar17);
            auVar17 = vsubps_avx(auVar80,auVar25);
            auVar20._4_4_ = local_1258._4_4_ * auVar17._4_4_;
            auVar20._0_4_ = local_1258._0_4_ * auVar17._0_4_;
            auVar20._8_4_ = local_1258._8_4_ * auVar17._8_4_;
            auVar20._12_4_ = local_1258._12_4_ * auVar17._12_4_;
            auVar20._16_4_ = local_1258._16_4_ * auVar17._16_4_;
            auVar20._20_4_ = local_1258._20_4_ * auVar17._20_4_;
            auVar20._24_4_ = local_1258._24_4_ * auVar17._24_4_;
            auVar20._28_4_ = auVar17._28_4_;
            auVar17 = vsubps_avx(auVar109,auVar24);
            auVar21._4_4_ = local_1278._4_4_ * auVar17._4_4_;
            auVar21._0_4_ = local_1278._0_4_ * auVar17._0_4_;
            auVar21._8_4_ = local_1278._8_4_ * auVar17._8_4_;
            auVar21._12_4_ = local_1278._12_4_ * auVar17._12_4_;
            auVar21._16_4_ = local_1278._16_4_ * auVar17._16_4_;
            auVar21._20_4_ = local_1278._20_4_ * auVar17._20_4_;
            auVar21._24_4_ = local_1278._24_4_ * auVar17._24_4_;
            auVar21._28_4_ = auVar17._28_4_;
            auVar17 = vminps_avx(auVar20,auVar21);
            auVar18 = vsubps_avx(auVar134,auVar23);
            auVar22._4_4_ = local_1298._4_4_ * auVar18._4_4_;
            auVar22._0_4_ = local_1298._0_4_ * auVar18._0_4_;
            auVar22._8_4_ = local_1298._8_4_ * auVar18._8_4_;
            auVar22._12_4_ = local_1298._12_4_ * auVar18._12_4_;
            auVar22._16_4_ = local_1298._16_4_ * auVar18._16_4_;
            auVar22._20_4_ = local_1298._20_4_ * auVar18._20_4_;
            auVar22._24_4_ = local_1298._24_4_ * auVar18._24_4_;
            auVar22._28_4_ = auVar18._28_4_;
            auVar18 = vminps_avx(auVar22,local_12d8);
            auVar17 = vminps_avx(auVar17,auVar18);
            auVar69 = vcmpps_avx(auVar69,auVar17,2);
            auVar118 = vpcmpeqd_avx(auVar17._0_16_,auVar17._0_16_);
            auVar88 = vpmovsxbd_avx(auVar88 ^ auVar118);
            auVar43 = vpmovsxbd_avx(auVar43 ^ auVar118);
            auVar49._16_16_ = auVar43;
            auVar49._0_16_ = auVar88;
            auVar17 = vcvtdq2ps_avx(auVar49);
            auVar59._8_4_ = 0xbf800000;
            auVar59._0_8_ = 0xbf800000bf800000;
            auVar59._12_4_ = 0xbf800000;
            auVar59._16_4_ = 0xbf800000;
            auVar59._20_4_ = 0xbf800000;
            auVar59._24_4_ = 0xbf800000;
            auVar59._28_4_ = 0xbf800000;
            auVar17 = vcmpps_avx(auVar59,auVar17,1);
            auVar69 = vandps_avx(auVar69,auVar17);
            uVar33 = vmovmskps_avx(auVar69);
            unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),uVar33);
          }
          if ((sVar39 & 8) == 0) {
            if (unaff_RBP == 0) {
              iVar37 = 4;
            }
            else {
              uVar38 = sVar39 & 0xfffffffffffffff0;
              lVar30 = 0;
              if (unaff_RBP != 0) {
                for (; (unaff_RBP >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                }
              }
              iVar37 = 0;
              sVar39 = *(size_t *)(uVar38 + lVar30 * 8);
              uVar31 = unaff_RBP - 1 & unaff_RBP;
              if (uVar31 != 0) {
                local_1500->ptr = sVar39;
                lVar30 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                  }
                }
                uVar29 = uVar31 - 1;
                while( true ) {
                  local_1500 = local_1500 + 1;
                  sVar39 = *(size_t *)(uVar38 + lVar30 * 8);
                  uVar29 = uVar29 & uVar31;
                  if (uVar29 == 0) break;
                  local_1500->ptr = sVar39;
                  lVar30 = 0;
                  if (uVar29 != 0) {
                    for (; (uVar29 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                    }
                  }
                  uVar31 = uVar29 - 1;
                }
              }
            }
          }
          else {
            iVar37 = 6;
          }
        } while (iVar37 == 0);
        uVar38 = uVar41;
        if (iVar37 == 6) {
          iVar37 = 0;
          local_14c8 = (ulong)((uint)sVar39 & 0xf) - 8;
          bVar42 = local_14c8 != 0;
          if (bVar42) {
            uVar31 = sVar39 & 0xfffffffffffffff0;
            pSVar3 = local_14f8->scene;
            local_14c0 = 0;
            do {
              lVar30 = local_14c0 * 0x50;
              ppfVar4 = (pSVar3->vertices).items;
              pfVar5 = ppfVar4[*(uint *)(uVar31 + 0x30 + lVar30)];
              pfVar6 = ppfVar4[*(uint *)(uVar31 + 0x34 + lVar30)];
              pfVar7 = ppfVar4[*(uint *)(uVar31 + 0x38 + lVar30)];
              pfVar8 = ppfVar4[*(uint *)(uVar31 + 0x3c + lVar30)];
              auVar118 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar31 + lVar30)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar31 + 8 + lVar30)));
              auVar88 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar31 + lVar30)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar31 + 8 + lVar30)));
              auVar119 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar31 + 4 + lVar30)),
                                       *(undefined1 (*) [16])
                                        (pfVar8 + *(uint *)(uVar31 + 0xc + lVar30)));
              auVar43 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar31 + 4 + lVar30)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar31 + 0xc + lVar30)));
              auVar101 = vunpcklps_avx(auVar88,auVar43);
              auVar52 = vunpcklps_avx(auVar118,auVar119);
              auVar43 = vunpckhps_avx(auVar118,auVar119);
              auVar119 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar31 + 0x10 + lVar30)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar31 + 0x18 + lVar30)));
              auVar88 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar31 + 0x10 + lVar30)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar31 + 0x18 + lVar30)));
              auVar72 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar31 + 0x14 + lVar30)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar31 + 0x1c + lVar30)));
              auVar118 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar31 + 0x14 + lVar30)),
                                       *(undefined1 (*) [16])
                                        (pfVar8 + *(uint *)(uVar31 + 0x1c + lVar30)));
              auVar61 = vunpcklps_avx(auVar88,auVar118);
              auVar73 = vunpcklps_avx(auVar119,auVar72);
              auVar72 = vunpckhps_avx(auVar119,auVar72);
              auVar119 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar31 + 0x20 + lVar30)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar31 + 0x28 + lVar30)));
              auVar88 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar31 + 0x20 + lVar30)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar31 + 0x28 + lVar30)));
              auVar60 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar31 + 0x24 + lVar30)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar31 + 0x2c + lVar30)));
              auVar118 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar31 + 0x24 + lVar30)),
                                       *(undefined1 (*) [16])
                                        (pfVar8 + *(uint *)(uVar31 + 0x2c + lVar30)));
              auVar89 = vunpcklps_avx(auVar88,auVar118);
              auVar102 = vunpcklps_avx(auVar119,auVar60);
              auVar60 = vunpckhps_avx(auVar119,auVar60);
              puVar1 = (undefined8 *)(uVar31 + 0x30 + lVar30);
              local_1398 = *puVar1;
              uStack_1390 = puVar1[1];
              puVar1 = (undefined8 *)(uVar31 + 0x40 + lVar30);
              local_13a8 = *puVar1;
              uStack_13a0 = puVar1[1];
              uVar33 = *(undefined4 *)&(ray->org).field_0;
              auVar153._4_4_ = uVar33;
              auVar153._0_4_ = uVar33;
              auVar153._8_4_ = uVar33;
              auVar153._12_4_ = uVar33;
              uVar33 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar161._4_4_ = uVar33;
              auVar161._0_4_ = uVar33;
              auVar161._8_4_ = uVar33;
              auVar161._12_4_ = uVar33;
              uVar33 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar167._4_4_ = uVar33;
              auVar167._0_4_ = uVar33;
              auVar167._8_4_ = uVar33;
              auVar167._12_4_ = uVar33;
              auVar88 = vsubps_avx(auVar52,auVar153);
              auVar43 = vsubps_avx(auVar43,auVar161);
              auVar118 = vsubps_avx(auVar101,auVar167);
              auVar119 = vsubps_avx(auVar73,auVar153);
              auVar72 = vsubps_avx(auVar72,auVar161);
              auVar101 = vsubps_avx(auVar61,auVar167);
              auVar52 = vsubps_avx(auVar102,auVar153);
              auVar60 = vsubps_avx(auVar60,auVar161);
              auVar61 = vsubps_avx(auVar89,auVar167);
              auVar73 = vsubps_avx(auVar52,auVar88);
              auVar89 = vsubps_avx(auVar60,auVar43);
              auVar102 = vsubps_avx(auVar61,auVar118);
              fVar86 = auVar43._0_4_;
              fVar87 = auVar60._0_4_ + fVar86;
              fVar81 = auVar43._4_4_;
              fVar95 = auVar60._4_4_ + fVar81;
              fVar11 = auVar43._8_4_;
              fVar97 = auVar60._8_4_ + fVar11;
              fVar14 = auVar43._12_4_;
              fVar98 = auVar60._12_4_ + fVar14;
              fVar94 = auVar118._0_4_;
              fVar99 = auVar61._0_4_ + fVar94;
              fVar83 = auVar118._4_4_;
              fVar110 = auVar61._4_4_ + fVar83;
              fVar12 = auVar118._8_4_;
              fVar111 = auVar61._8_4_ + fVar12;
              fVar15 = auVar118._12_4_;
              fVar112 = auVar61._12_4_ + fVar15;
              fVar71 = auVar102._0_4_;
              auVar140._0_4_ = fVar71 * fVar87;
              fVar82 = auVar102._4_4_;
              auVar140._4_4_ = fVar82 * fVar95;
              fVar50 = auVar102._8_4_;
              auVar140._8_4_ = fVar50 * fVar97;
              fVar51 = auVar102._12_4_;
              auVar140._12_4_ = fVar51 * fVar98;
              fVar175 = auVar89._0_4_;
              auVar154._0_4_ = fVar175 * fVar99;
              fVar176 = auVar89._4_4_;
              auVar154._4_4_ = fVar176 * fVar110;
              fVar177 = auVar89._8_4_;
              auVar154._8_4_ = fVar177 * fVar111;
              fVar178 = auVar89._12_4_;
              auVar154._12_4_ = fVar178 * fVar112;
              auVar89 = vsubps_avx(auVar154,auVar140);
              fVar96 = auVar88._0_4_;
              fVar135 = auVar52._0_4_ + fVar96;
              fVar85 = auVar88._4_4_;
              fVar144 = auVar52._4_4_ + fVar85;
              fVar13 = auVar88._8_4_;
              fVar147 = auVar52._8_4_ + fVar13;
              fVar16 = auVar88._12_4_;
              fVar150 = auVar52._12_4_ + fVar16;
              fVar165 = auVar73._0_4_;
              auVar104._0_4_ = fVar165 * fVar99;
              fVar169 = auVar73._4_4_;
              auVar104._4_4_ = fVar169 * fVar110;
              fVar171 = auVar73._8_4_;
              auVar104._8_4_ = fVar171 * fVar111;
              fVar173 = auVar73._12_4_;
              auVar104._12_4_ = fVar173 * fVar112;
              auVar155._0_4_ = fVar135 * fVar71;
              auVar155._4_4_ = fVar144 * fVar82;
              auVar155._8_4_ = fVar147 * fVar50;
              auVar155._12_4_ = fVar150 * fVar51;
              auVar73 = vsubps_avx(auVar155,auVar104);
              auVar141._0_4_ = fVar175 * fVar135;
              auVar141._4_4_ = fVar176 * fVar144;
              auVar141._8_4_ = fVar177 * fVar147;
              auVar141._12_4_ = fVar178 * fVar150;
              auVar90._0_4_ = fVar165 * fVar87;
              auVar90._4_4_ = fVar169 * fVar95;
              auVar90._8_4_ = fVar171 * fVar97;
              auVar90._12_4_ = fVar173 * fVar98;
              auVar102 = vsubps_avx(auVar90,auVar141);
              local_1528._4_4_ = (ray->dir).field_0.m128[2];
              fVar87 = (ray->dir).field_0.m128[1];
              local_1518._4_4_ = (ray->dir).field_0.m128[0];
              local_1388._0_4_ =
                   local_1518._4_4_ * auVar89._0_4_ +
                   fVar87 * auVar73._0_4_ + local_1528._4_4_ * auVar102._0_4_;
              local_1388._4_4_ =
                   local_1518._4_4_ * auVar89._4_4_ +
                   fVar87 * auVar73._4_4_ + local_1528._4_4_ * auVar102._4_4_;
              local_1388._8_4_ =
                   local_1518._4_4_ * auVar89._8_4_ +
                   fVar87 * auVar73._8_4_ + local_1528._4_4_ * auVar102._8_4_;
              local_1388._12_4_ =
                   local_1518._4_4_ * auVar89._12_4_ +
                   fVar87 * auVar73._12_4_ + local_1528._4_4_ * auVar102._12_4_;
              auVar43 = vsubps_avx(auVar43,auVar72);
              auVar118 = vsubps_avx(auVar118,auVar101);
              fVar95 = fVar86 + auVar72._0_4_;
              fVar97 = fVar81 + auVar72._4_4_;
              fVar98 = fVar11 + auVar72._8_4_;
              fVar99 = fVar14 + auVar72._12_4_;
              fVar110 = auVar101._0_4_ + fVar94;
              fVar111 = auVar101._4_4_ + fVar83;
              fVar112 = auVar101._8_4_ + fVar12;
              fVar135 = auVar101._12_4_ + fVar15;
              fVar136 = auVar118._0_4_;
              auVar168._0_4_ = fVar136 * fVar95;
              fVar145 = auVar118._4_4_;
              auVar168._4_4_ = fVar145 * fVar97;
              fVar148 = auVar118._8_4_;
              auVar168._8_4_ = fVar148 * fVar98;
              fVar151 = auVar118._12_4_;
              auVar168._12_4_ = fVar151 * fVar99;
              fVar160 = auVar43._0_4_;
              auVar74._0_4_ = fVar160 * fVar110;
              fVar162 = auVar43._4_4_;
              auVar74._4_4_ = fVar162 * fVar111;
              fVar163 = auVar43._8_4_;
              auVar74._8_4_ = fVar163 * fVar112;
              fVar164 = auVar43._12_4_;
              auVar74._12_4_ = fVar164 * fVar135;
              auVar43 = vsubps_avx(auVar74,auVar168);
              auVar88 = vsubps_avx(auVar88,auVar119);
              fVar166 = auVar88._0_4_;
              auVar105._0_4_ = fVar166 * fVar110;
              fVar170 = auVar88._4_4_;
              auVar105._4_4_ = fVar170 * fVar111;
              fVar172 = auVar88._8_4_;
              auVar105._8_4_ = fVar172 * fVar112;
              fVar174 = auVar88._12_4_;
              auVar105._12_4_ = fVar174 * fVar135;
              fVar110 = auVar119._0_4_ + fVar96;
              fVar111 = auVar119._4_4_ + fVar85;
              fVar112 = auVar119._8_4_ + fVar13;
              fVar135 = auVar119._12_4_ + fVar16;
              auVar142._0_4_ = fVar136 * fVar110;
              auVar142._4_4_ = fVar145 * fVar111;
              auVar142._8_4_ = fVar148 * fVar112;
              auVar142._12_4_ = fVar151 * fVar135;
              auVar88 = vsubps_avx(auVar142,auVar105);
              auVar126._0_4_ = fVar160 * fVar110;
              auVar126._4_4_ = fVar162 * fVar111;
              auVar126._8_4_ = fVar163 * fVar112;
              auVar126._12_4_ = fVar164 * fVar135;
              auVar91._0_4_ = fVar166 * fVar95;
              auVar91._4_4_ = fVar170 * fVar97;
              auVar91._8_4_ = fVar172 * fVar98;
              auVar91._12_4_ = fVar174 * fVar99;
              auVar118 = vsubps_avx(auVar91,auVar126);
              local_1378._0_4_ =
                   local_1518._4_4_ * auVar43._0_4_ +
                   fVar87 * auVar88._0_4_ + local_1528._4_4_ * auVar118._0_4_;
              local_1378._4_4_ =
                   local_1518._4_4_ * auVar43._4_4_ +
                   fVar87 * auVar88._4_4_ + local_1528._4_4_ * auVar118._4_4_;
              local_1378._8_4_ =
                   local_1518._4_4_ * auVar43._8_4_ +
                   fVar87 * auVar88._8_4_ + local_1528._4_4_ * auVar118._8_4_;
              local_1378._12_4_ =
                   local_1518._4_4_ * auVar43._12_4_ +
                   fVar87 * auVar88._12_4_ + local_1528._4_4_ * auVar118._12_4_;
              auVar88 = vsubps_avx(auVar119,auVar52);
              fVar144 = auVar119._0_4_ + auVar52._0_4_;
              fVar147 = auVar119._4_4_ + auVar52._4_4_;
              fVar150 = auVar119._8_4_ + auVar52._8_4_;
              fVar84 = auVar119._12_4_ + auVar52._12_4_;
              auVar43 = vsubps_avx(auVar72,auVar60);
              fVar110 = auVar60._0_4_ + auVar72._0_4_;
              fVar111 = auVar60._4_4_ + auVar72._4_4_;
              fVar112 = auVar60._8_4_ + auVar72._8_4_;
              fVar135 = auVar60._12_4_ + auVar72._12_4_;
              auVar118 = vsubps_avx(auVar101,auVar61);
              fVar95 = auVar101._0_4_ + auVar61._0_4_;
              fVar97 = auVar101._4_4_ + auVar61._4_4_;
              fVar98 = auVar101._8_4_ + auVar61._8_4_;
              fVar99 = auVar101._12_4_ + auVar61._12_4_;
              fVar137 = auVar118._0_4_;
              auVar53._0_4_ = fVar137 * fVar110;
              fVar146 = auVar118._4_4_;
              auVar53._4_4_ = fVar146 * fVar111;
              fVar149 = auVar118._8_4_;
              auVar53._8_4_ = fVar149 * fVar112;
              fVar152 = auVar118._12_4_;
              auVar53._12_4_ = fVar152 * fVar135;
              fVar156 = auVar43._0_4_;
              auVar127._0_4_ = fVar156 * fVar95;
              fVar157 = auVar43._4_4_;
              auVar127._4_4_ = fVar157 * fVar97;
              fVar158 = auVar43._8_4_;
              auVar127._8_4_ = fVar158 * fVar98;
              fVar159 = auVar43._12_4_;
              auVar127._12_4_ = fVar159 * fVar99;
              auVar43 = vsubps_avx(auVar127,auVar53);
              fVar100 = auVar88._0_4_;
              auVar44._0_4_ = fVar100 * fVar95;
              fVar95 = auVar88._4_4_;
              auVar44._4_4_ = fVar95 * fVar97;
              fVar97 = auVar88._8_4_;
              auVar44._8_4_ = fVar97 * fVar98;
              fVar98 = auVar88._12_4_;
              auVar44._12_4_ = fVar98 * fVar99;
              auVar128._0_4_ = fVar137 * fVar144;
              auVar128._4_4_ = fVar146 * fVar147;
              auVar128._8_4_ = fVar149 * fVar150;
              auVar128._12_4_ = fVar152 * fVar84;
              auVar88 = vsubps_avx(auVar128,auVar44);
              auVar75._0_4_ = fVar156 * fVar144;
              auVar75._4_4_ = fVar157 * fVar147;
              auVar75._8_4_ = fVar158 * fVar150;
              auVar75._12_4_ = fVar159 * fVar84;
              auVar62._0_4_ = fVar100 * fVar110;
              auVar62._4_4_ = fVar95 * fVar111;
              auVar62._8_4_ = fVar97 * fVar112;
              auVar62._12_4_ = fVar98 * fVar135;
              auVar118 = vsubps_avx(auVar62,auVar75);
              local_1528._0_4_ = local_1528._4_4_;
              fStack_1520 = local_1528._4_4_;
              fStack_151c = local_1528._4_4_;
              local_1518._0_4_ = local_1518._4_4_;
              fStack_1510 = local_1518._4_4_;
              fStack_150c = local_1518._4_4_;
              auVar45._0_4_ =
                   local_1518._4_4_ * auVar43._0_4_ +
                   fVar87 * auVar88._0_4_ + local_1528._4_4_ * auVar118._0_4_;
              auVar45._4_4_ =
                   local_1518._4_4_ * auVar43._4_4_ +
                   fVar87 * auVar88._4_4_ + local_1528._4_4_ * auVar118._4_4_;
              auVar45._8_4_ =
                   local_1518._4_4_ * auVar43._8_4_ +
                   fVar87 * auVar88._8_4_ + local_1528._4_4_ * auVar118._8_4_;
              auVar45._12_4_ =
                   local_1518._4_4_ * auVar43._12_4_ +
                   fVar87 * auVar88._12_4_ + local_1528._4_4_ * auVar118._12_4_;
              local_1368._0_4_ = auVar45._0_4_ + local_1388._0_4_ + local_1378._0_4_;
              local_1368._4_4_ = auVar45._4_4_ + local_1388._4_4_ + local_1378._4_4_;
              local_1368._8_4_ = auVar45._8_4_ + local_1388._8_4_ + local_1378._8_4_;
              local_1368._12_4_ = auVar45._12_4_ + local_1388._12_4_ + local_1378._12_4_;
              auVar88 = vminps_avx(local_1388,local_1378);
              auVar43 = vminps_avx(auVar88,auVar45);
              auVar63._8_4_ = 0x7fffffff;
              auVar63._0_8_ = 0x7fffffff7fffffff;
              auVar63._12_4_ = 0x7fffffff;
              auVar88 = vandps_avx(local_1368,auVar63);
              auVar64._0_4_ = auVar88._0_4_ * 1.1920929e-07;
              auVar64._4_4_ = auVar88._4_4_ * 1.1920929e-07;
              auVar64._8_4_ = auVar88._8_4_ * 1.1920929e-07;
              auVar64._12_4_ = auVar88._12_4_ * 1.1920929e-07;
              uVar32 = CONCAT44(auVar64._4_4_,auVar64._0_4_);
              auVar76._0_8_ = uVar32 ^ 0x8000000080000000;
              auVar76._8_4_ = -auVar64._8_4_;
              auVar76._12_4_ = -auVar64._12_4_;
              auVar43 = vcmpps_avx(auVar43,auVar76,5);
              auVar118 = vmaxps_avx(local_1388,local_1378);
              auVar118 = vmaxps_avx(auVar118,auVar45);
              auVar118 = vcmpps_avx(auVar118,auVar64,2);
              auVar43 = vorps_avx(auVar43,auVar118);
              mapUV = (UVIdentity<4>)0x0;
              local_1358 = &mapUV;
              auVar118 = auVar27 & auVar43;
              if ((((auVar118 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar118 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar118 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar118[0xf] < '\0') {
                auVar46._0_4_ = fVar160 * fVar71;
                auVar46._4_4_ = fVar162 * fVar82;
                auVar46._8_4_ = fVar163 * fVar50;
                auVar46._12_4_ = fVar164 * fVar51;
                auVar54._0_4_ = fVar175 * fVar136;
                auVar54._4_4_ = fVar176 * fVar145;
                auVar54._8_4_ = fVar177 * fVar148;
                auVar54._12_4_ = fVar178 * fVar151;
                auVar72 = vsubps_avx(auVar54,auVar46);
                auVar65._0_4_ = fVar136 * fVar156;
                auVar65._4_4_ = fVar145 * fVar157;
                auVar65._8_4_ = fVar148 * fVar158;
                auVar65._12_4_ = fVar151 * fVar159;
                auVar77._0_4_ = fVar160 * fVar137;
                auVar77._4_4_ = fVar162 * fVar146;
                auVar77._8_4_ = fVar163 * fVar149;
                auVar77._12_4_ = fVar164 * fVar152;
                auVar101 = vsubps_avx(auVar77,auVar65);
                auVar129._8_4_ = 0x7fffffff;
                auVar129._0_8_ = 0x7fffffff7fffffff;
                auVar129._12_4_ = 0x7fffffff;
                auVar118 = vandps_avx(auVar46,auVar129);
                auVar119 = vandps_avx(auVar65,auVar129);
                auVar118 = vcmpps_avx(auVar118,auVar119,1);
                local_1308 = vblendvps_avx(auVar101,auVar72,auVar118);
                auVar55._0_4_ = fVar166 * fVar137;
                auVar55._4_4_ = fVar170 * fVar146;
                auVar55._8_4_ = fVar172 * fVar149;
                auVar55._12_4_ = fVar174 * fVar152;
                auVar66._0_4_ = fVar166 * fVar71;
                auVar66._4_4_ = fVar170 * fVar82;
                auVar66._8_4_ = fVar172 * fVar50;
                auVar66._12_4_ = fVar174 * fVar51;
                auVar78._0_4_ = fVar165 * fVar136;
                auVar78._4_4_ = fVar169 * fVar145;
                auVar78._8_4_ = fVar171 * fVar148;
                auVar78._12_4_ = fVar173 * fVar151;
                auVar72 = vsubps_avx(auVar66,auVar78);
                auVar115._0_4_ = fVar136 * fVar100;
                auVar115._4_4_ = fVar145 * fVar95;
                auVar115._8_4_ = fVar148 * fVar97;
                auVar115._12_4_ = fVar151 * fVar98;
                auVar101 = vsubps_avx(auVar115,auVar55);
                auVar118 = vandps_avx(auVar78,auVar129);
                auVar119 = vandps_avx(auVar55,auVar129);
                auVar118 = vcmpps_avx(auVar118,auVar119,1);
                local_12f8 = vblendvps_avx(auVar101,auVar72,auVar118);
                auVar67._0_4_ = fVar160 * fVar100;
                auVar67._4_4_ = fVar162 * fVar95;
                auVar67._8_4_ = fVar163 * fVar97;
                auVar67._12_4_ = fVar164 * fVar98;
                auVar79._0_4_ = fVar165 * fVar160;
                auVar79._4_4_ = fVar169 * fVar162;
                auVar79._8_4_ = fVar171 * fVar163;
                auVar79._12_4_ = fVar173 * fVar164;
                auVar106._0_4_ = fVar175 * fVar166;
                auVar106._4_4_ = fVar176 * fVar170;
                auVar106._8_4_ = fVar177 * fVar172;
                auVar106._12_4_ = fVar178 * fVar174;
                auVar116._0_4_ = fVar166 * fVar156;
                auVar116._4_4_ = fVar170 * fVar157;
                auVar116._8_4_ = fVar172 * fVar158;
                auVar116._12_4_ = fVar174 * fVar159;
                auVar72 = vsubps_avx(auVar79,auVar106);
                auVar101 = vsubps_avx(auVar116,auVar67);
                auVar118 = vandps_avx(auVar106,auVar129);
                auVar119 = vandps_avx(auVar67,auVar129);
                auVar118 = vcmpps_avx(auVar118,auVar119,1);
                local_12e8 = vblendvps_avx(auVar101,auVar72,auVar118);
                fVar71 = local_1308._0_4_ * local_1518._4_4_ +
                         local_12f8._0_4_ * fVar87 + local_12e8._0_4_ * local_1528._4_4_;
                fVar95 = local_1308._4_4_ * local_1518._4_4_ +
                         local_12f8._4_4_ * fVar87 + local_12e8._4_4_ * local_1528._4_4_;
                fVar82 = local_1308._8_4_ * local_1518._4_4_ +
                         local_12f8._8_4_ * fVar87 + local_12e8._8_4_ * local_1528._4_4_;
                fVar87 = local_1308._12_4_ * local_1518._4_4_ +
                         local_12f8._12_4_ * fVar87 + local_12e8._12_4_ * local_1528._4_4_;
                auVar107._0_4_ = fVar71 + fVar71;
                auVar107._4_4_ = fVar95 + fVar95;
                auVar107._8_4_ = fVar82 + fVar82;
                auVar107._12_4_ = fVar87 + fVar87;
                fVar71 = local_1308._0_4_ * fVar96 +
                         local_12f8._0_4_ * fVar86 + local_12e8._0_4_ * fVar94;
                fVar81 = local_1308._4_4_ * fVar85 +
                         local_12f8._4_4_ * fVar81 + local_12e8._4_4_ * fVar83;
                fVar83 = local_1308._8_4_ * fVar13 +
                         local_12f8._8_4_ * fVar11 + local_12e8._8_4_ * fVar12;
                fVar85 = local_1308._12_4_ * fVar16 +
                         local_12f8._12_4_ * fVar14 + local_12e8._12_4_ * fVar15;
                auVar118 = vrcpps_avx(auVar107);
                fVar87 = auVar118._0_4_;
                auVar130._0_4_ = auVar107._0_4_ * fVar87;
                fVar86 = auVar118._4_4_;
                auVar130._4_4_ = auVar107._4_4_ * fVar86;
                fVar94 = auVar118._8_4_;
                auVar130._8_4_ = auVar107._8_4_ * fVar94;
                fVar96 = auVar118._12_4_;
                auVar130._12_4_ = auVar107._12_4_ * fVar96;
                auVar143._8_4_ = 0x3f800000;
                auVar143._0_8_ = &DAT_3f8000003f800000;
                auVar143._12_4_ = 0x3f800000;
                auVar118 = vsubps_avx(auVar143,auVar130);
                local_1318._0_4_ = (fVar71 + fVar71) * (fVar87 + fVar87 * auVar118._0_4_);
                local_1318._4_4_ = (fVar81 + fVar81) * (fVar86 + fVar86 * auVar118._4_4_);
                local_1318._8_4_ = (fVar83 + fVar83) * (fVar94 + fVar94 * auVar118._8_4_);
                local_1318._12_4_ = (fVar85 + fVar85) * (fVar96 + fVar96 * auVar118._12_4_);
                uVar33 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar117._4_4_ = uVar33;
                auVar117._0_4_ = uVar33;
                auVar117._8_4_ = uVar33;
                auVar117._12_4_ = uVar33;
                auVar118 = vcmpps_avx(auVar117,local_1318,2);
                fVar87 = ray->tfar;
                auVar131._4_4_ = fVar87;
                auVar131._0_4_ = fVar87;
                auVar131._8_4_ = fVar87;
                auVar131._12_4_ = fVar87;
                auVar119 = vcmpps_avx(local_1318,auVar131,2);
                auVar118 = vandps_avx(auVar118,auVar119);
                auVar119 = vcmpps_avx(auVar107,_DAT_01feba10,4);
                auVar118 = vandps_avx(auVar119,auVar118);
                auVar43 = vandps_avx(auVar43,auVar27);
                auVar118 = vpslld_avx(auVar118,0x1f);
                auVar119 = vpsrad_avx(auVar118,0x1f);
                auVar118 = auVar43 & auVar119;
                if ((((auVar118 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar118 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar118 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar118[0xf] < '\0') {
                  local_1348 = vandps_avx(auVar119,auVar43);
                  auVar43 = vrcpps_avx(local_1368);
                  fVar87 = auVar43._0_4_;
                  auVar56._0_4_ = local_1368._0_4_ * fVar87;
                  fVar86 = auVar43._4_4_;
                  auVar56._4_4_ = local_1368._4_4_ * fVar86;
                  fVar94 = auVar43._8_4_;
                  auVar56._8_4_ = local_1368._8_4_ * fVar94;
                  fVar96 = auVar43._12_4_;
                  auVar56._12_4_ = local_1368._12_4_ * fVar96;
                  auVar68._8_4_ = 0x3f800000;
                  auVar68._0_8_ = &DAT_3f8000003f800000;
                  auVar68._12_4_ = 0x3f800000;
                  auVar43 = vsubps_avx(auVar68,auVar56);
                  auVar47._0_4_ = fVar87 + fVar87 * auVar43._0_4_;
                  auVar47._4_4_ = fVar86 + fVar86 * auVar43._4_4_;
                  auVar47._8_4_ = fVar94 + fVar94 * auVar43._8_4_;
                  auVar47._12_4_ = fVar96 + fVar96 * auVar43._12_4_;
                  auVar57._8_4_ = 0x219392ef;
                  auVar57._0_8_ = 0x219392ef219392ef;
                  auVar57._12_4_ = 0x219392ef;
                  auVar88 = vcmpps_avx(auVar88,auVar57,5);
                  auVar88 = vandps_avx(auVar88,auVar47);
                  auVar58._0_4_ = local_1388._0_4_ * auVar88._0_4_;
                  auVar58._4_4_ = local_1388._4_4_ * auVar88._4_4_;
                  auVar58._8_4_ = local_1388._8_4_ * auVar88._8_4_;
                  auVar58._12_4_ = local_1388._12_4_ * auVar88._12_4_;
                  local_1338 = vminps_avx(auVar58,auVar68);
                  auVar48._0_4_ = local_1378._0_4_ * auVar88._0_4_;
                  auVar48._4_4_ = local_1378._4_4_ * auVar88._4_4_;
                  auVar48._8_4_ = local_1378._8_4_ * auVar88._8_4_;
                  auVar48._12_4_ = local_1378._12_4_ * auVar88._12_4_;
                  local_1328 = vminps_avx(auVar48,auVar68);
                  uVar33 = vmovmskps_avx(local_1348);
                  uVar41 = CONCAT44((int)(uVar41 >> 0x20),uVar33);
                  do {
                    uVar32 = 0;
                    if (uVar41 != 0) {
                      for (; (uVar41 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                      }
                    }
                    h.geomID = *(uint *)((long)&local_1398 + uVar32 * 4);
                    pGVar9 = (pSVar3->geometries).items[h.geomID].ptr;
                    if ((pGVar9->mask & ray->mask) == 0) {
                      uVar41 = uVar41 ^ 1L << (uVar32 & 0x3f);
                      bVar26 = true;
                    }
                    else {
                      pRVar10 = local_14f8->args;
                      if ((pRVar10->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar26 = false;
                      }
                      else {
                        h.u = *(float *)(local_1338 + uVar32 * 4);
                        h.v = *(float *)(local_1328 + uVar32 * 4);
                        args.context = local_14f8->user;
                        h.primID = *(uint *)((long)&local_13a8 + uVar32 * 4);
                        h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_1308 + uVar32 * 4);
                        h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_12f8 + uVar32 * 4);
                        h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_12e8 + uVar32 * 4);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        fVar87 = ray->tfar;
                        ray->tfar = *(float *)(local_1318 + uVar32 * 4);
                        local_152c = -1;
                        args.valid = &local_152c;
                        args.geometryUserPtr = pGVar9->userPtr;
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        args.ray = (RTCRayN *)ray;
                        if (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0031003f:
                          if (pRVar10->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar10->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar10->filter)(&args);
                            }
                            if (*args.valid == 0) goto LAB_0031008f;
                          }
                          bVar26 = false;
                        }
                        else {
                          local_1518 = ray;
                          local_1528 = uVar36;
                          (*pGVar9->occlusionFilterN)(&args);
                          ray = local_1518;
                          uVar36 = local_1528;
                          if (*args.valid != 0) goto LAB_0031003f;
LAB_0031008f:
                          ray->tfar = fVar87;
                          uVar41 = uVar41 ^ 1L << (uVar32 & 0x3f);
                          bVar26 = true;
                        }
                      }
                    }
                    iVar37 = 0;
                    if (!bVar26) {
                      uVar32 = local_14e0;
                      uVar34 = local_14d0;
                      uVar35 = local_14d8;
                      uVar40 = local_14e8;
                      uVar38 = local_14f0;
                      if (bVar42) {
                        ray->tfar = -INFINITY;
                        iVar37 = 3;
                      }
                      goto LAB_0031011b;
                    }
                  } while (uVar41 != 0);
                  uVar41 = 0;
                }
              }
              iVar37 = 0;
              local_14c0 = local_14c0 + 1;
              bVar42 = local_14c0 < local_14c8;
              uVar32 = local_14e0;
              uVar34 = local_14d0;
              uVar35 = local_14d8;
              uVar40 = local_14e8;
              uVar38 = local_14f0;
            } while (local_14c0 != local_14c8);
          }
        }
LAB_0031011b:
        uVar41 = uVar38;
      } while (iVar37 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }